

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

logic_t __thiscall slang::SVInt::reductionXor(SVInt *this)

{
  bitwidth_t bVar1;
  uint32_t count;
  SVInt *this_local;
  
  if (((this->super_SVIntStorage).unknownFlag & 1U) == 0) {
    bVar1 = countOnes(this);
    if ((bVar1 & 1) == 0) {
      logic_t::logic_t((logic_t *)((long)&this_local + 7),'\0');
    }
    else {
      logic_t::logic_t((logic_t *)((long)&this_local + 7),'\x01');
    }
  }
  else {
    this_local._7_1_ = 0x80;
  }
  return (logic_t)this_local._7_1_;
}

Assistant:

logic_t SVInt::reductionXor() const {
    if (unknownFlag)
        return logic_t::x;

    // reduction xor basically determines whether the number of set
    // bits in the number is even or odd
    uint32_t count = countOnes();
    if (count % 2 == 0)
        return logic_t(0);

    return logic_t(1);
}